

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracteventdispatcher.cpp
# Opt level: O0

int __thiscall
QAbstractEventDispatcherV2::remainingTime(QAbstractEventDispatcherV2 *this,int timerId)

{
  int iVar1;
  undefined4 in_ESI;
  nanoseconds in_RDI;
  QAbstractEventDispatcherV2 *self;
  
  (**(code **)(*(long *)in_RDI.__r + 0xd8))(in_RDI.__r,in_ESI);
  iVar1 = fromDuration<int>(in_RDI);
  return iVar1;
}

Assistant:

int QAbstractEventDispatcherV2::remainingTime(int timerId)
{
    auto self = static_cast<QAbstractEventDispatcherV2 *>(this);
    return fromDuration<int>(self->remainingTime(Qt::TimerId(timerId)));
}